

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::parseAreaLight(SemanticParser *this,SP *in)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  ostream *poVar6;
  element_type *peVar7;
  __shared_ptr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  element_type *in_RDI;
  SP SVar9;
  SP diffuse_1;
  vec2f v;
  SP diffuse;
  shared_ptr<pbrt::DiffuseAreaLightBB> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  string *in_stack_fffffffffffffe30;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_139;
  string local_138 [16];
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  string *in_stack_fffffffffffffee0;
  ParamSet *in_stack_fffffffffffffee8;
  string local_110 [55];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  float local_68;
  float local_64;
  allocator<char> local_39;
  string local_38 [56];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    std::
    __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1955dd);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (char *)in_stack_fffffffffffffdf8);
    if (bVar1) {
      std::
      __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x195606);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,
                 (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                 (allocator<char> *)in_stack_fffffffffffffe30);
      bVar1 = syntactic::ParamSet::hasParam2f
                        ((ParamSet *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                         in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      if (bVar1) {
        std::make_shared<pbrt::DiffuseAreaLightBB>();
        std::
        __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1956a7);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,
                   (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                   (allocator<char> *)in_stack_fffffffffffffe30);
        syntactic::ParamSet::getParam2f
                  (in_stack_fffffffffffffee8,(float *)in_stack_fffffffffffffee0,
                   (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
        peVar4 = std::
                 __shared_ptr_access<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x195750);
        peVar4->temperature = local_68;
        peVar4 = std::
                 __shared_ptr_access<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x195774);
        peVar4->scale = local_64;
        std::
        __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x19578c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,
                   (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                   (allocator<char> *)in_stack_fffffffffffffe30);
        iVar3 = syntactic::ParamSet::getParam1i
                          (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffedc);
        peVar4 = std::
                 __shared_ptr_access<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::DiffuseAreaLightBB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1957ec);
        peVar4->nSamples = iVar3;
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator(&local_b1);
        std::shared_ptr<pbrt::AreaLight>::shared_ptr<pbrt::DiffuseAreaLightBB,void>
                  ((shared_ptr<pbrt::AreaLight> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   in_stack_fffffffffffffdf8);
        std::shared_ptr<pbrt::DiffuseAreaLightBB>::~shared_ptr
                  ((shared_ptr<pbrt::DiffuseAreaLightBB> *)0x19582f);
        _Var8._M_pi = extraout_RDX_00;
      }
      else {
        peVar7 = std::
                 __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x195926);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(peVar7->super_Node).super_ParamSet;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                   (allocator<char> *)in_stack_fffffffffffffe30);
        bVar2 = syntactic::ParamSet::hasParam3f
                          ((ParamSet *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38)
                           ,in_stack_fffffffffffffe30);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator(&local_d9);
        if ((bVar2 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "Warning: diffuse area light, but no \'L\' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::shared_ptr<pbrt::AreaLight>::shared_ptr((shared_ptr<pbrt::AreaLight> *)0x195bff);
          _Var8._M_pi = extraout_RDX_02;
        }
        else {
          std::make_shared<pbrt::DiffuseAreaLightRGB>();
          std::
          __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1959ba);
          std::
          __shared_ptr_access<pbrt::DiffuseAreaLightRGB,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::DiffuseAreaLightRGB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1959cd);
          __a = (allocator<char> *)&stack0xfffffffffffffeef;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffe38),__a);
          syntactic::ParamSet::getParam3f
                    (in_stack_fffffffffffffee8,(float *)in_stack_fffffffffffffee0,
                     (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
          std::
          __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x195a43);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffe38),__a);
          iVar3 = syntactic::ParamSet::getParam1i
                            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffedc);
          peVar5 = std::
                   __shared_ptr_access<pbrt::DiffuseAreaLightRGB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::DiffuseAreaLightRGB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x195aa3);
          peVar5->nSamples = iVar3;
          std::__cxx11::string::~string(local_138);
          std::allocator<char>::~allocator(&local_139);
          std::shared_ptr<pbrt::AreaLight>::shared_ptr<pbrt::DiffuseAreaLightRGB,void>
                    ((shared_ptr<pbrt::AreaLight> *)CONCAT44(iVar3,in_stack_fffffffffffffe00),
                     (shared_ptr<pbrt::DiffuseAreaLightRGB> *)in_stack_fffffffffffffdf8);
          std::shared_ptr<pbrt::DiffuseAreaLightRGB>::~shared_ptr
                    ((shared_ptr<pbrt::DiffuseAreaLightRGB> *)0x195ae6);
          _Var8._M_pi = extraout_RDX_01;
        }
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"Warning: unknown area light type \'");
      peVar7 = std::
               __shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x195c25);
      poVar6 = std::operator<<(poVar6,(string *)&(peVar7->super_Node).type);
      poVar6 = std::operator<<(poVar6,"\'.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<pbrt::AreaLight>::shared_ptr((shared_ptr<pbrt::AreaLight> *)0x195c60);
      _Var8._M_pi = extraout_RDX_03;
    }
  }
  else {
    std::shared_ptr<pbrt::AreaLight>::shared_ptr((shared_ptr<pbrt::AreaLight> *)0x1955cb);
    _Var8._M_pi = extraout_RDX;
  }
  SVar9.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar9.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar9.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AreaLight::SP SemanticParser::parseAreaLight(pbrt::syntactic::AreaLightSource::SP in)
  {
    if (!in)
      return AreaLight::SP();

    if (in->type == "diffuse") {
      /*! parsing here is a bit more tricky, because the L parameter
          can be either an RGB, or a blackbody. Since the latter has
          two floats to the former's three floats we'll simply switch
          based on parameter count here .... */
      if (in->hasParam2f("L")) {
        DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        vec2f v;
        in->getParam2f(&v.x,"L");
        diffuse->temperature = v.x;
        diffuse->scale       = v.y;
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else if (in->hasParam3f("L")) {
        DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
        in->getParam3f(&diffuse->L.x,"L");
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else {
        std::cout << "Warning: diffuse area light, but no 'L' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring." << std::endl;
        return AreaLight::SP();
      }
      // auto L_it = in->param.find("L");
      // if (L_it == in->param.end()) {
      //   std::cout << "Warning: diffuse area light, but no 'L' parameter?! Ignoring." << std::endl;
      //   return AreaLight::SP();
      // }

      // syntactic::Param::SP param = L_it->second;
      // if (param->getType() == "blackbody") {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // } else {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // }
      
    }

    std::cout << "Warning: unknown area light type '" << in->type << "'." << std::endl;
    return AreaLight::SP();
  }